

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_square_brackets(void)

{
  bool bVar1;
  json *pjVar2;
  json local_280;
  undefined1 local_228 [8];
  json o;
  json local_178;
  json local_120;
  json local_b8;
  undefined1 local_60 [8];
  json a;
  
  argo::json::json((json *)local_60,array_e);
  argo::json::json(&local_b8,10);
  argo::json::append((json *)local_60,&local_b8);
  argo::json::~json(&local_b8);
  argo::json::json(&local_120,20.0);
  argo::json::append((json *)local_60,&local_120);
  argo::json::~json(&local_120);
  argo::json::json(&local_178,"asdf");
  argo::json::append((json *)local_60,&local_178);
  argo::json::~json(&local_178);
  argo::json::json((json *)&o.field_0x50,true);
  argo::json::append((json *)local_60,(json *)&o.field_0x50);
  argo::json::~json((json *)&o.field_0x50);
  test_square_brackets_const_array((json *)local_60);
  pjVar2 = argo::json::operator[]((json *)local_60,0);
  bVar1 = argo::json::operator!=(pjVar2,10);
  if (bVar1) {
LAB_0011d482:
    std::operator<<((ostream *)jlog,"FAIL: array access failed\n");
  }
  else {
    pjVar2 = argo::json::operator[]((json *)local_60,1);
    bVar1 = argo::json::operator!=(pjVar2,20.0);
    if (bVar1) goto LAB_0011d482;
    pjVar2 = argo::json::operator[]((json *)local_60,2);
    bVar1 = argo::json::operator!=(pjVar2,"asdf");
    if (bVar1) goto LAB_0011d482;
    pjVar2 = argo::json::operator[]((json *)local_60,3);
    bVar1 = argo::json::operator_cast_to_bool(pjVar2);
    if (!bVar1) goto LAB_0011d482;
  }
  argo::json::json((json *)local_228,object_e);
  pjVar2 = argo::json::operator[]((json *)local_228,"a");
  argo::json::json(&local_280);
  bVar1 = argo::json::operator!=(pjVar2,&local_280);
  argo::json::~json(&local_280);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"FAIL: empty element isn\'t null - failed\n");
  }
  pjVar2 = argo::json::operator[]((json *)local_228,"b");
  argo::json::operator=(pjVar2,1);
  pjVar2 = argo::json::operator[]((json *)local_228,"c");
  argo::json::operator=(pjVar2,1.1);
  pjVar2 = argo::json::operator[]((json *)local_228,"d");
  argo::json::operator=(pjVar2,"asdf");
  pjVar2 = argo::json::operator[]((json *)local_228,"e");
  argo::json::operator=(pjVar2,true);
  test_square_brackets_const_object((json *)local_228);
  pjVar2 = argo::json::operator[]((json *)local_228,"b");
  bVar1 = argo::json::operator!=(pjVar2,1);
  if (!bVar1) {
    pjVar2 = argo::json::operator[]((json *)local_228,"c");
    bVar1 = argo::json::operator!=(pjVar2,1.1);
    if (!bVar1) {
      pjVar2 = argo::json::operator[]((json *)local_228,"d");
      bVar1 = argo::json::operator!=(pjVar2,"asdf");
      if (!bVar1) {
        pjVar2 = argo::json::operator[]((json *)local_228,"e");
        bVar1 = argo::json::operator_cast_to_bool(pjVar2);
        if (bVar1) goto LAB_0011d7f4;
      }
    }
  }
  std::operator<<((ostream *)jlog,"FAIL: object access failed\n");
LAB_0011d7f4:
  argo::json::~json((json *)local_228);
  argo::json::~json((json *)local_60);
  return;
}

Assistant:

void test_square_brackets()
{
    json a(json::array_e);
    a.append(10);
    a.append(20.0);
    a.append("asdf");
    a.append(true);

    test_square_brackets_const_array(a);

    if ((a[0] != 10) ||
        (a[1] != 20.0) ||
        (a[2] != "asdf") ||
         !a[3])
    {
        jlog << "FAIL: array access failed\n";
    }

    json o(json::object_e);
    if (o["a"] != json())
    {
        jlog << "FAIL: empty element isn't null - failed\n";
    }
    o["b"] = 1;
    o["c"] = 1.1;
    o["d"] = "asdf";
    o["e"] = true;

    test_square_brackets_const_object(o);

    if ((o["b"] != 1) ||
        (o["c"] != 1.1) ||
        (o["d"] != "asdf") ||
        !o["e"])
    {
        jlog << "FAIL: object access failed\n";
    }
}